

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O1

bool duckdb::StrpTimeFormat::TryParse(string *format_string,string *text,ParseResult *result)

{
  pointer pcVar1;
  ulong uVar2;
  bool bVar3;
  InvalidInputException *this;
  char *data;
  uint uVar4;
  string error;
  StrpTimeFormat format;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 local_130;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [120];
  
  StrpTimeFormat((StrpTimeFormat *)local_a8);
  ::std::__cxx11::string::_M_assign((string *)(local_a8 + 8));
  StrTimeFormat::ParseFormatSpecifier(&local_128,format_string,(StrTimeFormat *)local_a8);
  if (local_128._M_string_length == 0) {
    pcVar1 = (text->_M_dataplus)._M_p;
    uVar2 = text->_M_string_length;
    uVar4 = (uint)uVar2;
    if (uVar4 < 0xd) {
      local_130 = 0;
      local_138 = 0;
      uStack_134 = 0;
      if (uVar4 != 0) {
        switchD_012dd528::default(&local_138,pcVar1,(ulong)(uVar4 & 0xf));
      }
    }
    else {
      local_138 = *(undefined4 *)pcVar1;
      uStack_134 = SUB84(pcVar1,0);
      local_130 = (undefined4)((ulong)pcVar1 >> 0x20);
    }
    local_108._M_string_length = CONCAT44(local_130,uStack_134);
    local_108._M_dataplus._M_p = (pointer)CONCAT44(local_138,uVar4);
    data = (char *)local_108._M_string_length;
    if (uVar4 < 0xd) {
      data = (char *)((long)&local_108._M_dataplus._M_p + 4);
    }
    bVar3 = Parse((StrpTimeFormat *)local_a8,data,uVar2 & 0xffffffff,result,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    StrTimeFormat::~StrTimeFormat((StrTimeFormat *)local_a8);
    return bVar3;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"Failed to parse format specifier %s: %s","");
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  pcVar1 = (format_string->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar1,pcVar1 + format_string->_M_string_length);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_128._M_dataplus._M_p,
             local_128._M_dataplus._M_p + local_128._M_string_length);
  InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_108,&local_c8,&local_e8);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool StrpTimeFormat::TryParse(const string &format_string, const string &text, ParseResult &result) {
	StrpTimeFormat format;
	format.format_specifier = format_string;
	string error = StrTimeFormat::ParseFormatSpecifier(format_string, format);
	if (!error.empty()) {
		throw InvalidInputException("Failed to parse format specifier %s: %s", format_string, error);
	}
	return format.Parse(text, result);
}